

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

HFSubWorker * __thiscall
AbstractModuleClient::subscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule,
          hfs_data_callback_fn userFoo,void *args)

{
  bool bVar1;
  SubType SVar2;
  HFSubWorker *this_00;
  string *in_RDX;
  string *in_RSI;
  string *in_stack_00000028;
  string *in_stack_00000030;
  MlmWrap *in_stack_00000038;
  HighFreqSub *sub;
  hfs_data_callback_fn in_stack_00000118;
  int in_stack_00000124;
  HighFreqDataType *in_stack_00000128;
  MlmWrap *in_stack_00000130;
  HighFreqDataType *this_01;
  string *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  network_pimpl *in_stack_fffffffffffffef8;
  string local_c8 [32];
  string local_a8 [32];
  HFSubWorker *local_88;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  MlmWrap *in_stack_ffffffffffffff98;
  string local_50 [72];
  HFSubWorker *local_8;
  
  std::__cxx11::string::string(local_50,in_RSI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,in_RDX);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  if (bVar1) {
    std::__cxx11::string::string(local_a8,in_RSI);
    std::__cxx11::string::string(local_c8,in_RDX);
    this_00 = (HFSubWorker *)
              MlmWrap::getHfSubObject(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
    local_88 = this_00;
    SVar2 = HighFreqSub::getSubSockType((HighFreqSub *)this_00);
    if (SVar2 == ST_WORKER) {
      return local_88;
    }
  }
  bVar1 = network_pimpl::hfdt_exists
                    ((network_pimpl *)in_stack_fffffffffffffee8,(string *)in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
  if (bVar1) {
    this_01 = (HighFreqDataType *)&stack0xfffffffffffffea8;
    network_pimpl::find_hfdt
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               (string *)in_stack_fffffffffffffee8);
    local_8 = MlmWrap::createWorkerSub
                        (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000118,sub
                        );
    HighFreqDataType::~HighFreqDataType(this_01);
  }
  else {
    local_8 = (HFSubWorker *)0x0;
  }
  return local_8;
}

Assistant:

HFSubWorker* AbstractModuleClient::subscribeHighFreqData(std::string dataName, std::string originModule, hfs_data_callback_fn userFoo, void *args) {
    if (isHfTypeCurrentlySubbed(dataName, originModule)) { //if the module is already subbed, return the current sub object
        HighFreqSub* sub = getHfSubObject(dataName, originModule);
        if(sub->getSubSockType() == HighFreqSub::ST_WORKER)
            return (HFSubWorker*)sub;
    }

    if (state->hfdt_exists(dataName, originModule)) { //check to make sure the requested type is provided by another module
        return( createWorkerSub( state->find_hfdt(dataName, originModule), 1, userFoo, args ) );
    }
    else {
        // std::cerr << error("The specified type does not exist. Could not create Subscriber\n");
        return(NULL);
    }
}